

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory.cc
# Opt level: O3

size_type __thiscall lf::mesh::hybrid2d::MeshFactory::AddPoint(MeshFactory *this,coord_t *coord)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer puVar3;
  pointer puVar4;
  long *plVar5;
  pointer *__ptr;
  stringstream ss;
  string local_208;
  string local_1e8;
  string local_1c8;
  DenseStorage<double,__1,__1,_1,_0> local_1a8;
  ostream local_198 [376];
  
  if ((coord->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows ==
      (ulong)this->dim_world_) {
    plVar5 = (long *)operator_new(0x18);
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              (&local_1a8,(DenseStorage<double,__1,__1,_1,_0> *)coord);
    *plVar5 = (long)&PTR_DimLocal_004a5948;
    plVar5[1] = (long)local_1a8.m_data;
    plVar5[2] = local_1a8.m_rows;
    local_208._M_dataplus._M_p = (pointer)plVar5;
    std::
    vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
    ::
    emplace_back<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>
              ((vector<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>,std::allocator<std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>>>
                *)&this->nodes_,
               (unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> *)
               &local_208);
    puVar3 = (this->nodes_).
             super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (this->nodes_).
             super__Vector_base<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>,_std::allocator<std::unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((long *)local_208._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_208._M_dataplus._M_p + 0x58))();
    }
    return (int)((ulong)((long)puVar4 - (long)puVar3) >> 3) - 1;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_198,"coord has incompatible number of rows.",0x26);
  paVar1 = &local_208.field_2;
  local_208._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,"coord.rows() == dim_world_","");
  paVar2 = &local_1e8.field_2;
  local_1e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
             ,"");
  std::__cxx11::stringbuf::str();
  base::AssertionFailed(&local_208,&local_1e8,0x14,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != paVar1) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  local_208._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"false","");
  local_1e8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/mesh/hybrid2d/mesh_factory.cc"
             ,"");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  base::AssertionFailed(&local_208,&local_1e8,0x14,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  abort();
}

Assistant:

MeshFactory::size_type MeshFactory::AddPoint(coord_t coord) {
  LF_ASSERT_MSG(coord.rows() == dim_world_,
                "coord has incompatible number of rows.");
  // Create default geometry object for a point from location vector
  hybrid2d::Mesh::GeometryPtr point_geo =
      std::make_unique<geometry::Point>(coord);
  nodes_.emplace_back(std::move(point_geo));
  return nodes_.size() - 1;
}